

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
mult_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (mult_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_4)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  pbVar3 = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(in_RDI);
  if ((bVar1) &&
     (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(pbVar3),
     bVar1)) {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64(pbVar3);
    if ((bVar1) &&
       (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64(pbVar3),
       bVar1)) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<long>
                (in_stack_ffffffffffffffb0);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<long>
                (in_stack_ffffffffffffffb0);
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      basic_json<long>(long,jsoncons::semantic_tag,std::enable_if<ext_traits::
      is_signed_integer<long>::value&&((sizeof(long))<=(8ul)),int>::type_
                (in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,none,0x5c154f);
      uVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64(pbVar3);
      if ((bVar1) &&
         (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                            (pbVar3), bVar1)) {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                  (in_stack_ffffffffffffffb0);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                  (in_stack_ffffffffffffffb0);
        jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        basic_json<unsigned_long>(unsigned_long,jsoncons::semantic_tag,std::enable_if<ext_traits::
        is_unsigned_integer<unsigned_long>::value&&((sizeof(unsigned_long))<=(8ul)),int>::type_
                  (in_stack_ffffffffffffffb0,(unsigned_long)in_stack_ffffffffffffffa8,none,0x5c15a4)
        ;
        uVar2 = extraout_RDX_01;
      }
      else {
        pbVar3 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this
                           );
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (pbVar3,(double)in_stack_ffffffffffffffa8,none);
        uVar2 = extraout_RDX_02;
      }
    }
  }
  else {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    uVar2 = extraout_RDX;
  }
  bVar4.field_0.int64_.val_ = uVar2;
  bVar4.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar4.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            if (!(lhs.is_number() && rhs.is_number()))
            {
                return Json::null();
            }
            if (lhs.is_int64() && rhs.is_int64())
            {
                return Json(((lhs.template as<int64_t>() * rhs.template as<int64_t>())), semantic_tag::none);
            }
            if (lhs.is_uint64() && rhs.is_uint64())
            {
                return Json((lhs.template as<uint64_t>() * rhs.template as<uint64_t>()), semantic_tag::none);
            }
            return Json((lhs.as_double() * rhs.as_double()), semantic_tag::none);
        }